

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O1

pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> * __thiscall
vmips::CFGNode::branch<vmips::ble,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>&>
          (pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>
           *__return_storage_ptr__,CFGNode *this,string *next,string *target,
          shared_ptr<vmips::VirtReg> *args,shared_ptr<vmips::VirtReg> *args_1)

{
  _Atomic_word *p_Var1;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> *this_00;
  int iVar2;
  shared_ptr<vmips::CFGNode> b;
  shared_ptr<vmips::ble> instr;
  shared_ptr<vmips::CFGNode> a;
  shared_ptr<vmips::Instruction> local_78;
  shared_ptr<vmips::CFGNode> local_68;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<vmips::CFGNode> local_48;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> *local_38;
  
  local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38 = __return_storage_ptr__;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::CFGNode,std::allocator<vmips::CFGNode>,vmips::Function*&,std::__cxx11::string&>
            (&local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CFGNode **)&local_48,(allocator<vmips::CFGNode> *)&local_68,(Function **)this,next);
  local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::CFGNode,std::allocator<vmips::CFGNode>,vmips::Function*&,std::__cxx11::string&>
            (&local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CFGNode **)&local_68,(allocator<vmips::CFGNode> *)&local_58,(Function **)this,target);
  local_58 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::ble,std::allocator<vmips::ble>,std::shared_ptr<vmips::CFGNode>&,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>&>
            (&local_50,(ble **)&local_58,(allocator<vmips::ble> *)&local_78,&local_68,args,args_1);
  this_00 = local_38;
  local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_50._M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)(this + 0x30),&local_78);
  if (local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count =
           (local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count =
           (local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_weak_count + 1;
    }
  }
  std::vector<std::weak_ptr<vmips::CFGNode>,std::allocator<std::weak_ptr<vmips::CFGNode>>>::
  emplace_back<std::weak_ptr<vmips::CFGNode>>
            ((vector<std::weak_ptr<vmips::CFGNode>,std::allocator<std::weak_ptr<vmips::CFGNode>>> *)
             (this + 0x48),(weak_ptr<vmips::CFGNode> *)&local_78);
  if (local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count =
           (local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count =
           (local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_weak_count + 1;
    }
  }
  std::vector<std::weak_ptr<vmips::CFGNode>,std::allocator<std::weak_ptr<vmips::CFGNode>>>::
  emplace_back<std::weak_ptr<vmips::CFGNode>>
            ((vector<std::weak_ptr<vmips::CFGNode>,std::allocator<std::weak_ptr<vmips::CFGNode>>> *)
             (this + 0x48),(weak_ptr<vmips::CFGNode> *)&local_78);
  if (local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_78.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  std::pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>::
  pair<std::shared_ptr<vmips::CFGNode>_&,_std::shared_ptr<vmips::CFGNode>_&,_true>
            (this_00,&local_48,&local_68);
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  if (local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return this_00;
}

Assistant:

std::pair<std::shared_ptr<CFGNode>, std::shared_ptr<CFGNode>>
        branch(std::string next, std::string target, Args &&... args) {
            auto a = std::make_shared<CFGNode>(function, next);
            auto b = std::make_shared<CFGNode>(function, target);
            auto instr = std::make_shared<Instr>(b, std::forward<Args>(args)...);
            instructions.push_back(instr);
            out_edges.push_back(a);
            out_edges.push_back(b);
            return {a, b};
        }